

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnnbitset * rnn_findbitset(rnndb *db,char *name)

{
  int iVar1;
  rnnbitset **pprVar2;
  rnnbitset *prVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = db->bitsetsnum;
  if (0 < (long)iVar1) {
    pprVar2 = db->bitsets;
    lVar5 = 0;
    do {
      prVar3 = pprVar2[lVar5];
      iVar4 = strcmp(prVar3->name,name);
      if (iVar4 == 0) {
        return prVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (rnnbitset *)0x0;
}

Assistant:

struct rnnbitset *rnn_findbitset (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->bitsetsnum; i++)
		if (!strcmp(db->bitsets[i]->name, name))
			return db->bitsets[i];
	return 0;
}